

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O1

void __thiscall deqp::egl::MakeCurrentPerfCase::logTestInfo(MakeCurrentPerfCase *this)

{
  ostringstream *poVar1;
  TestLog *log;
  ScopedLogSection section;
  ScopedLogSection local_1c8;
  string local_1c0;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1a0._0_8_ = local_1a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"Test Info","");
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"Test case information.","");
  tcu::ScopedLogSection::ScopedLogSection(&local_1c8,log,(string *)local_1a0,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Context count: ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_128);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Surfaces count: ",0x10);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_128);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Sample count: ",0xe);
  std::ostream::operator<<(poVar1,(this->m_spec).sampleCount);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_128);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Iteration count: ",0x11);
  std::ostream::operator<<(poVar1,(this->m_spec).iterationCount);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_128);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Window count: ",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_128);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Pixmap count: ",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_128);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"PBuffer count: ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_128);
  if ((this->m_spec).release == true) {
    poVar1 = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Context is released after each use. Both binding and releasing context are included in result time."
               ,99);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_128);
  }
  tcu::TestLog::endSection(local_1c8.m_log);
  return;
}

Assistant:

void MakeCurrentPerfCase::logTestInfo (void)
{
	TestLog& log = m_testCtx.getLog();

	{
		tcu::ScopedLogSection	section(log, "Test Info", "Test case information.");

		log << TestLog::Message << "Context count: "	<< m_contexts.size()											<< TestLog::EndMessage;
		log << TestLog::Message << "Surfaces count: "	<< m_surfaces.size()											<< TestLog::EndMessage;
		log << TestLog::Message << "Sample count: "	<< m_spec.sampleCount												<< TestLog::EndMessage;
		log << TestLog::Message << "Iteration count: "	<< m_spec.iterationCount										<< TestLog::EndMessage;
		log << TestLog::Message << "Window count: "	<< m_windows.size()													<< TestLog::EndMessage;
		log << TestLog::Message << "Pixmap count: "	<< m_pixmaps.size()													<< TestLog::EndMessage;
		log << TestLog::Message << "PBuffer count: "	<< (m_surfaces.size() - m_windows.size() - m_pixmaps.size())	<< TestLog::EndMessage;

		if (m_spec.release)
			log << TestLog::Message << "Context is released after each use. Both binding and releasing context are included in result time." << TestLog::EndMessage;
	}
}